

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::validate_settings(session_impl *this)

{
  validate_setting(this,0x4076,0,2);
  validate_setting(this,0x4077,0,2);
  validate_setting(this,0x4078,1,3);
  validate_setting(this,0x4060,0,1);
  validate_setting(this,0x407b,0,5);
  validate_setting(this,0x4025,0,3);
  validate_setting(this,0x4024,0,3);
  validate_setting(this,0x401f,0,3);
  validate_setting(this,0x4020,0,3);
  validate_setting(this,0x4019,0,1);
  validate_setting(this,0x4097,0,2);
  return;
}

Assistant:

void session_impl::validate_settings()
	{
		validate_setting(settings_pack::out_enc_policy, 0, 2);
		validate_setting(settings_pack::in_enc_policy, 0, 2);
		validate_setting(settings_pack::allowed_enc_level, 1, 3);
		validate_setting(settings_pack::mixed_mode_algorithm, 0, 1);
		validate_setting(settings_pack::proxy_type, 0, 5);
		validate_setting(settings_pack::disk_io_read_mode, 0, 3);
		validate_setting(settings_pack::disk_io_write_mode, 0, 3);
		validate_setting(settings_pack::choking_algorithm, 0, 3);
		validate_setting(settings_pack::seed_choking_algorithm, 0, 3);
		validate_setting(settings_pack::suggest_mode, 0, 1);
		validate_setting(settings_pack::disk_write_mode, 0, 2);
	}